

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O1

void __thiscall
mxx::sync_basic_ostream<char,_std::char_traits<char>_>::sync_flush
          (sync_basic_ostream<char,_std::char_traits<char>_> *this)

{
  string *psVar1;
  long lVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> recv_string;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<char,_std::allocator<char>_> strings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  char *local_98;
  long local_90;
  char local_88 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<char,_std::allocator<char>_> local_60;
  char *local_48;
  char *local_40;
  char local_38 [16];
  
  std::__cxx11::stringbuf::str();
  local_98 = local_40;
  gather<unsigned_long>
            (&local_78,(unsigned_long *)&local_98,1,
             *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18,
             *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8);
  gatherv<char>(&local_60,local_48,(size_t)local_40,&local_78,
                *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18,
                *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8);
  if ((*(int *)(*(long *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8 +
               0x14) ==
       *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18) &&
     (0 < *(int *)(*(long *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8 +
                  0x10))) {
    lVar2 = 0;
    pcVar3 = local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_98 = local_88;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)&local_98,pcVar3,
                 pcVar3 + local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar2]);
      std::__ostream_insert<char,std::char_traits<char>>
                (*(ostream **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10
                 ,local_98,local_90);
      pcVar3 = pcVar3 + local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar2];
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < *(int *)(*(long *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).
                                        field_0x8 + 0x10));
  }
  psVar1 = *(string **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  std::__cxx11::stringbuf::str(psVar1);
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void sync_flush() {
        // communicate all data to rank `root`
        std::basic_string<CharT, Traits> str = m_buf->str();
        std::vector<size_t> recv_counts = mxx::gather(str.size(), m_root, m_comm);
        std::vector<CharT> strings = mxx::gatherv(&str[0], str.size(), recv_counts, m_root, m_comm);
        // on `root`: output all strings
        if (m_comm.rank() == m_root) {
            typename std::vector<CharT>::iterator begin = strings.begin();
            for (int i = 0; i < m_comm.size(); ++i) {
                std::basic_string<CharT, Traits> recv_string(begin, begin + recv_counts[i]);
                *m_stream << recv_string;
                begin += recv_counts[i];
            }
        }
        // clear buffer content
        m_buf->str("");
    }